

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Cex.c
# Opt level: O0

Vec_Ptr_t * Llb4_Nonlin4VerifyCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  Vec_Ptr_t *pVVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Aig_Obj_t *pAVar8;
  void *pvVar9;
  uint *p_00;
  Aig_Obj_t *pAVar10;
  int local_44;
  int local_40;
  int iBit;
  int k;
  int i;
  Aig_Obj_t *pObjRo;
  Aig_Obj_t *pObjRi;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vStates;
  Abc_Cex_t *p_local;
  Aig_Man_t *pAig_local;
  
  iVar5 = p->iFrame;
  vStates = (Vec_Ptr_t *)p;
  p_local = (Abc_Cex_t *)pAig;
  iVar4 = Aig_ManRegNum(pAig);
  iVar4 = Abc_BitWordNum(iVar4);
  pAVar8 = (Aig_Obj_t *)Vec_PtrAllocSimInfo(iVar5 + 1,iVar4);
  pObj = pAVar8;
  iVar5 = Aig_ManRegNum((Aig_Man_t *)p_local);
  iVar5 = Abc_BitWordNum(iVar5);
  Vec_PtrCleanSimInfo((Vec_Ptr_t *)pAVar8,0,iVar5);
  Aig_ManCleanMarkB((Aig_Man_t *)p_local);
  pAVar8 = Aig_ManConst1((Aig_Man_t *)p_local);
  *(ulong *)&pAVar8->field_0x18 = *(ulong *)&pAVar8->field_0x18 & 0xffffffffffffffdf | 0x20;
  for (iBit = 0; iVar5 = Saig_ManRegNum((Aig_Man_t *)p_local), iBit < iVar5; iBit = iBit + 1) {
    pVVar1 = *(Vec_Ptr_t **)&p_local->nBits;
    iVar5 = Saig_ManPiNum((Aig_Man_t *)p_local);
    pvVar9 = Vec_PtrEntry(pVVar1,iBit + iVar5);
    *(ulong *)((long)pvVar9 + 0x18) = *(ulong *)((long)pvVar9 + 0x18) & 0xffffffffffffffdf;
  }
  local_44 = *(int *)&vStates->pArray;
  for (iBit = 0; iBit <= vStates->nSize; iBit = iBit + 1) {
    for (local_40 = 0; iVar5 = Saig_ManRegNum((Aig_Man_t *)p_local), local_40 < iVar5;
        local_40 = local_40 + 1) {
      pVVar1 = *(Vec_Ptr_t **)&p_local->nBits;
      iVar5 = Saig_ManPiNum((Aig_Man_t *)p_local);
      pvVar9 = Vec_PtrEntry(pVVar1,local_40 + iVar5);
      if ((*(ulong *)((long)pvVar9 + 0x18) >> 5 & 1) != 0) {
        p_00 = (uint *)Vec_PtrEntry((Vec_Ptr_t *)pObj,iBit);
        Abc_InfoSetBit(p_00,local_40);
      }
    }
    for (local_40 = 0; iVar5 = Saig_ManPiNum((Aig_Man_t *)p_local), local_40 < iVar5;
        local_40 = local_40 + 1) {
      pvVar9 = Vec_PtrEntry(*(Vec_Ptr_t **)&p_local->nBits,local_40);
      uVar7 = Abc_InfoHasBit((uint *)&vStates[1].nSize,local_44);
      *(ulong *)((long)pvVar9 + 0x18) =
           *(ulong *)((long)pvVar9 + 0x18) & 0xffffffffffffffdf | ((ulong)uVar7 & 1) << 5;
      local_44 = local_44 + 1;
    }
    for (local_40 = 0; iVar5 = Vec_PtrSize(*(Vec_Ptr_t **)&p_local[1].nPis), local_40 < iVar5;
        local_40 = local_40 + 1) {
      pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)&p_local[1].nPis,local_40);
      if ((pAVar8 != (Aig_Obj_t *)0x0) && (iVar5 = Aig_ObjIsNode(pAVar8), iVar5 != 0)) {
        pAVar10 = Aig_ObjFanin0(pAVar8);
        uVar3 = *(ulong *)&pAVar10->field_0x18;
        uVar7 = Aig_ObjFaninC0(pAVar8);
        pAVar10 = Aig_ObjFanin1(pAVar8);
        uVar2 = *(ulong *)&pAVar10->field_0x18;
        uVar6 = Aig_ObjFaninC1(pAVar8);
        *(ulong *)&pAVar8->field_0x18 =
             *(ulong *)&pAVar8->field_0x18 & 0xffffffffffffffdf |
             ((ulong)(((uint)(uVar3 >> 5) & 1 ^ uVar7) & ((uint)(uVar2 >> 5) & 1 ^ uVar6)) & 1) << 5
        ;
      }
    }
    for (local_40 = 0; iVar5 = Vec_PtrSize(*(Vec_Ptr_t **)&p_local[1].iFrame), local_40 < iVar5;
        local_40 = local_40 + 1) {
      pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)&p_local[1].iFrame,local_40);
      pAVar10 = Aig_ObjFanin0(pAVar8);
      uVar3 = *(ulong *)&pAVar10->field_0x18;
      uVar7 = Aig_ObjFaninC0(pAVar8);
      *(ulong *)&pAVar8->field_0x18 =
           *(ulong *)&pAVar8->field_0x18 & 0xffffffffffffffdf |
           ((ulong)((uint)(uVar3 >> 5) & 1 ^ uVar7) & 1) << 5;
    }
    if (iBit == vStates->nSize) break;
    for (local_40 = 0; iVar5 = Saig_ManRegNum((Aig_Man_t *)p_local), local_40 < iVar5;
        local_40 = local_40 + 1) {
      pAVar8 = Saig_ManLi((Aig_Man_t *)p_local,local_40);
      pAVar10 = Saig_ManLo((Aig_Man_t *)p_local,local_40);
      *(ulong *)&pAVar10->field_0x18 =
           *(ulong *)&pAVar10->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)(*(ulong *)&pAVar8->field_0x18 >> 5) & 1) << 5;
    }
  }
  if (local_44 != vStates[1].nCap) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Cex.c"
                  ,0xfb,"Vec_Ptr_t *Llb4_Nonlin4VerifyCex(Aig_Man_t *, Abc_Cex_t *)");
  }
  iBit = Saig_ManPoNum((Aig_Man_t *)p_local);
  do {
    iBit = iBit + -1;
    if (iBit < 0) goto LAB_00aae043;
    pAVar8 = Aig_ManCo((Aig_Man_t *)p_local,iBit);
  } while ((*(ulong *)&pAVar8->field_0x18 >> 5 & 1) == 0);
  vStates->nCap = iBit;
LAB_00aae043:
  if (iBit == -1) {
    Vec_PtrFreeP((Vec_Ptr_t **)&pObj);
  }
  Aig_ManCleanMarkB((Aig_Man_t *)p_local);
  return (Vec_Ptr_t *)pObj;
}

Assistant:

Vec_Ptr_t * Llb4_Nonlin4VerifyCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Vec_Ptr_t * vStates;
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, k, iBit = 0;
    // create storage for states
    vStates = Vec_PtrAllocSimInfo( p->iFrame+1, Abc_BitWordNum(Aig_ManRegNum(pAig)) );
    Vec_PtrCleanSimInfo( vStates, 0, Abc_BitWordNum(Aig_ManRegNum(pAig)) );
    // verify counter-example
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = 0; //Abc_InfoHasBit(p->pData, iBit++);
    // do not require equal flop count in the AIG and in the CEX
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        // save current state
        Saig_ManForEachLo( pAig, pObj, k )
            if ( pObj->fMarkB )
                Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(vStates, i), k );
        // compute new state
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
/*
    {
        unsigned * pNext;
        Vec_PtrForEachEntry( unsigned *, vStates, pNext, i )
        {
            printf( "%4d : ", i );
            Extra_PrintBinary( stdout, pNext, Aig_ManRegNum(pAig) );
            printf( "\n" );
        }
    }
*/
    assert( iBit == p->nBits );
//    if ( Aig_ManCo(pAig, p->iPo)->fMarkB == 0 )
//        Vec_PtrFreeP( &vStates );
    for ( i = Saig_ManPoNum(pAig) - 1; i >= 0; i-- )
    {
        if ( Aig_ManCo(pAig, i)->fMarkB )
        {
            p->iPo = i;
            break;
        }
    }
    if ( i == -1 )
        Vec_PtrFreeP( &vStates );
    Aig_ManCleanMarkB(pAig);
    return vStates;
}